

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.pb.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::FloatValue::_InternalSerialize
          (FloatValue *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint uVar2;
  uint32_t *puVar3;
  UnknownFieldSet *unknown_fields;
  float value;
  float local_30 [2];
  FloatValue *pFStack_28;
  uint32_t cached_has_bits;
  FloatValue *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  FloatValue *this_local;
  
  local_30[1] = 0.0;
  pFStack_28 = this;
  this_ = (FloatValue *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)this;
  puVar3 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  if ((*puVar3 & 1) != 0) {
    local_30[0] = _internal_value(pFStack_28);
    uVar2 = absl::lts_20250127::bit_cast<unsigned_int,_float,_0>(local_30);
    if (uVar2 != 0) {
      stream_local = (EpsCopyOutputStream *)
                     protobuf::io::EpsCopyOutputStream::EnsureSpace
                               ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
      value = _internal_value(pFStack_28);
      stream_local = (EpsCopyOutputStream *)
                     internal::WireFormatLite::WriteFloatToArray(1,value,(uint8_t *)stream_local);
    }
  }
  bVar1 = internal::InternalMetadata::have_unknown_fields
                    (&(pFStack_28->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         internal::InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(pFStack_28->super_Message).super_MessageLite._internal_metadata_,
                    UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,(EpsCopyOutputStream *)this_);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL FloatValue::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const FloatValue& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FloatValue)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // float value = 1;
  if ((this_._impl_._has_bits_[0] & 0x00000001u) != 0) {
    if (::absl::bit_cast<::uint32_t>(this_._internal_value()) != 0) {
      target = stream->EnsureSpace(target);
      target = ::_pbi::WireFormatLite::WriteFloatToArray(
          1, this_._internal_value(), target);
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FloatValue)
  return target;
}